

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void duckdb::MapVector::EvalMapInvalidReason(MapInvalidReason reason)

{
  InternalException *this;
  InvalidInputException *pIVar1;
  undefined7 in_register_00000039;
  allocator local_39;
  string local_38;
  
  switch(CONCAT71(in_register_00000039,reason) & 0xffffffff) {
  case 0:
    return;
  case 1:
    pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"Map keys can not be NULL.",&local_39);
    InvalidInputException::InvalidInputException(pIVar1,&local_38);
    __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  case 2:
    pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"Map keys must be unique.",&local_39);
    InvalidInputException::InvalidInputException(pIVar1,&local_38);
    __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  case 3:
    pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"The map key list does not align with the map value list.",
               &local_39);
    InvalidInputException::InvalidInputException(pIVar1,&local_38);
    __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  case 4:
    pIVar1 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,
               "Invalid map argument(s). Valid map arguments are a list of key-value pairs (MAP {\'key1\': \'val1\', ...}), two lists (MAP ([1, 2], [10, 11])), or no arguments."
               ,&local_39);
    InvalidInputException::InvalidInputException(pIVar1,&local_38);
    __cxa_throw(pIVar1,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"MapInvalidReason not implemented",&local_39)
    ;
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
}

Assistant:

void MapVector::EvalMapInvalidReason(MapInvalidReason reason) {
	switch (reason) {
	case MapInvalidReason::VALID:
		return;
	case MapInvalidReason::DUPLICATE_KEY:
		throw InvalidInputException("Map keys must be unique.");
	case MapInvalidReason::NULL_KEY:
		throw InvalidInputException("Map keys can not be NULL.");
	case MapInvalidReason::NOT_ALIGNED:
		throw InvalidInputException("The map key list does not align with the map value list.");
	case MapInvalidReason::INVALID_PARAMS:
		throw InvalidInputException("Invalid map argument(s). Valid map arguments are a list of key-value pairs (MAP "
		                            "{'key1': 'val1', ...}), two lists (MAP ([1, 2], [10, 11])), or no arguments.");
	default:
		throw InternalException("MapInvalidReason not implemented");
	}
}